

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::first_element_by_path(xml_node *this,char_t *path_,char_t delimiter)

{
  char *pcVar1;
  char cVar2;
  xml_node_struct *p;
  bool bVar3;
  size_t count;
  size_t sVar4;
  xml_node_struct **ppxVar5;
  xml_node *this_00;
  char_t *pcVar6;
  char_t *rhs;
  char_t *pcVar7;
  char_t *path__00;
  xml_node found;
  xml_node local_48;
  xml_node local_40;
  xml_node local_38;
  
  this_00 = &local_48;
  local_48 = (xml_node)this->_root;
  if ((local_48._root != (xml_node_struct *)0x0) && (*path_ != '\0')) {
    if (*path_ == delimiter) {
      local_48 = root(&local_48);
      path_ = path_ + 1;
    }
    rhs = path_ + -1;
    do {
      pcVar6 = rhs;
      cVar2 = pcVar6[1];
      rhs = pcVar6 + 1;
    } while (cVar2 == delimiter);
    sVar4 = 0;
    do {
      count = sVar4;
      sVar4 = count + 1;
      if (rhs[count] == '\0') break;
    } while (rhs[count] != delimiter);
    if (sVar4 != 1) {
      pcVar7 = rhs + (count - 1);
      do {
        path__00 = pcVar7 + 1;
        pcVar1 = pcVar7 + 1;
        pcVar7 = path__00;
      } while (*pcVar1 == delimiter);
      if (sVar4 != 2 || cVar2 != '.') {
        if (((cVar2 != '.') || (sVar4 != 3)) || (pcVar6[2] != '.')) {
          ppxVar5 = &(local_48._root)->first_child;
          do {
            p = *ppxVar5;
            if (p == (xml_node_struct *)0x0) {
              xml_node(&local_38);
              return (xml_node)local_38._root;
            }
            if ((p->name != (char_t *)0x0) &&
               (bVar3 = impl::anon_unknown_0::strequalrange(p->name,rhs,count), bVar3)) {
              xml_node(&local_40,p);
              local_38 = first_element_by_path(&local_40,path__00,delimiter);
              if (local_38._root != (xml_node_struct *)0x0) {
                return (xml_node)local_38._root;
              }
            }
            ppxVar5 = &p->next_sibling;
          } while( true );
        }
        local_40 = parent(&local_48);
        this_00 = &local_40;
      }
      local_48 = first_element_by_path(this_00,path__00,delimiter);
    }
  }
  return (xml_node)local_48._root;
}

Assistant:

PUGI__FN xml_node xml_node::first_element_by_path(const char_t* path_, char_t delimiter) const
	{
		xml_node found = *this; // Current search context.

		if (!_root || !path_[0]) return found;

		if (path_[0] == delimiter)
		{
			// Absolute path; e.g. '/foo/bar'
			found = found.root();
			++path_;
		}

		const char_t* path_segment = path_;

		while (*path_segment == delimiter) ++path_segment;

		const char_t* path_segment_end = path_segment;

		while (*path_segment_end && *path_segment_end != delimiter) ++path_segment_end;

		if (path_segment == path_segment_end) return found;

		const char_t* next_segment = path_segment_end;

		while (*next_segment == delimiter) ++next_segment;

		if (*path_segment == '.' && path_segment + 1 == path_segment_end)
			return found.first_element_by_path(next_segment, delimiter);
		else if (*path_segment == '.' && *(path_segment+1) == '.' && path_segment + 2 == path_segment_end)
			return found.parent().first_element_by_path(next_segment, delimiter);
		else
		{
			for (xml_node_struct* j = found._root->first_child; j; j = j->next_sibling)
			{
				if (j->name && impl::strequalrange(j->name, path_segment, static_cast<size_t>(path_segment_end - path_segment)))
				{
					xml_node subsearch = xml_node(j).first_element_by_path(next_segment, delimiter);

					if (subsearch) return subsearch;
				}
			}

			return xml_node();
		}
	}